

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> __thiscall
absl::lts_20240722::flags_internal::FlagImpl::MakeInitValue(FlagImpl *this)

{
  void *__p;
  FlagDefaultKind FVar1;
  _Head_base<0UL,_void_*,_false> extraout_RDX;
  FlagImpl *in_RSI;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> uVar2;
  DynValueDeleter local_28;
  void *local_20;
  void *res;
  FlagImpl *this_local;
  
  local_20 = (void *)0x0;
  this_local = this;
  FVar1 = DefaultKind(in_RSI);
  if (FVar1 == kDynamicValue) {
    local_20 = Clone(in_RSI->op_,(in_RSI->default_value_).dynamic_value);
  }
  else if (FVar1 == kGenFunc) {
    local_20 = Alloc(in_RSI->op_);
    (*(in_RSI->default_value_).gen_func)(local_20);
  }
  else {
    local_20 = Clone(in_RSI->op_,&in_RSI->default_value_);
  }
  __p = local_20;
  DynValueDeleter::DynValueDeleter(&local_28,in_RSI->op_);
  std::unique_ptr<void,absl::lts_20240722::flags_internal::DynValueDeleter>::
  unique_ptr<absl::lts_20240722::flags_internal::DynValueDeleter,void>
            ((unique_ptr<void,absl::lts_20240722::flags_internal::DynValueDeleter> *)this,__p,
             &local_28);
  uVar2._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar2._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Tuple_impl<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>._M_head_impl.op
       = (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)
         (_Head_base<1UL,_absl::lts_20240722::flags_internal::DynValueDeleter,_false>)this;
  return (unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>)
         uVar2._M_t.super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>
         ._M_t.super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>;
}

Assistant:

std::unique_ptr<void, DynValueDeleter> FlagImpl::MakeInitValue() const {
  void* res = nullptr;
  switch (DefaultKind()) {
    case FlagDefaultKind::kDynamicValue:
      res = flags_internal::Clone(op_, default_value_.dynamic_value);
      break;
    case FlagDefaultKind::kGenFunc:
      res = flags_internal::Alloc(op_);
      (*default_value_.gen_func)(res);
      break;
    default:
      res = flags_internal::Clone(op_, &default_value_);
      break;
  }
  return {res, DynValueDeleter{op_}};
}